

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_HT_TRENDLINE_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000408;
  int *in_stack_00000410;
  int *in_stack_00000418;
  double *in_stack_00000420;
  int in_stack_0000042c;
  int in_stack_00000430;
  
  TVar1 = TA_HT_TRENDLINE(in_stack_00000430,in_stack_0000042c,in_stack_00000420,in_stack_00000418,
                          in_stack_00000410,in_stack_00000408);
  return TVar1;
}

Assistant:

TA_RetCode TA_HT_TRENDLINE_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_HT_TRENDLINE(
/* Generated */                      startIdx,
/* Generated */                      endIdx,
/* Generated */                      params->in[0].data.inReal, /* inReal */
/* Generated */                      outBegIdx, 
/* Generated */                      outNBElement, 
/* Generated */                      params->out[0].data.outReal /*  outReal */ );
/* Generated */ }